

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cc
# Opt level: O3

PolygonBody * apollonia::World::NewBox(Float mass,Float width,Float height,Vec2 *position)

{
  PolygonBody *this;
  initializer_list<apollonia::Vec2> __l;
  VertexList vertices;
  allocator_type local_4d;
  Float local_4c;
  vector<apollonia::Vec2,_std::allocator<apollonia::Vec2>_> local_48;
  Vec2 local_30;
  float fStack_28;
  float fStack_24;
  float fStack_20;
  undefined8 local_1c;
  float local_14;
  
  local_14 = height * -0.5;
  local_30.x = width * 0.5;
  local_1c = CONCAT44(local_30.x,local_14);
  local_30.y = height * 0.5;
  fStack_28 = width * -0.5;
  fStack_24 = height * 0.5;
  fStack_20 = width * -0.5;
  __l._M_len = 4;
  __l._M_array = &local_30;
  local_4c = mass;
  std::vector<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>::vector(&local_48,__l,&local_4d);
  this = (PolygonBody *)operator_new(0x70);
  PolygonBody::PolygonBody(this,local_4c,&local_48);
  (this->super_Body).position_ = *position;
  if (local_48.super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return this;
}

Assistant:

PolygonBody* World::NewBox(Float mass,
    Float width, Float height, const Vec2& position) {
  PolygonBody::VertexList vertices = {
    {width/2, height/2}, {-width/2, height/2},
    {-width/2, -height/2}, {width/2, -height/2}
  };
  auto body = new PolygonBody(mass, vertices);
  body->set_position(position);
  return body;
}